

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Accel * __thiscall embree::BVH8Factory::BVH8UserGeometryMB(BVH8Factory *this,Scene *scene)

{
  BVH8 *bvh;
  Builder *builder;
  AccelInstance *this_00;
  Intersectors intersectors;
  Intersectors IStack_138;
  
  bvh = (BVH8 *)BVHN<8>::operator_new(0x240);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&Object::type,scene);
  BVH8UserGeometryMBIntersectors(&IStack_138,this,bvh);
  builder = (*this->BVH8VirtualMBSceneBuilderSAH)(bvh,scene,0);
  this_00 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_00,(AccelData *)bvh,builder,&IStack_138);
  return &this_00->super_Accel;
}

Assistant:

Accel* BVH8Factory::BVH8UserGeometryMB(Scene* scene)
  {
    BVH8* accel = new BVH8(Object::type,scene);
    Accel::Intersectors intersectors = BVH8UserGeometryMBIntersectors(accel);
    Builder* builder = BVH8VirtualMBSceneBuilderSAH(accel,scene,0);
    return new AccelInstance(accel,builder,intersectors);
  }